

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall CGL::SceneObjects::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  undefined8 *puVar1;
  long lVar2;
  _List_node_base *p_Var3;
  iterator iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  mapped_type *pmVar8;
  Vector3D *pVVar9;
  list<CGL::Face,_std::allocator<CGL::Face>_> *plVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  ulong uVar15;
  ulong uVar16;
  Vertex *v;
  vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> verts;
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  vertexLabels;
  Vertex *local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  key_type local_a0;
  void *local_98;
  iterator iStack_90;
  Vertex **local_88;
  BSDF *local_78;
  HalfedgeMesh *local_70;
  _Hashtable<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_002a4f70;
  local_a8 = &this->indices;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = 0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_88 = (Vertex **)0x0;
  local_98 = (void *)0x0;
  iStack_90._M_current = (Vertex **)0x0;
  p_Var14 = (mesh->vertices).super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  local_78 = bsdf;
  local_70 = mesh;
  if (p_Var14 != (_List_node_base *)&mesh->vertices) {
    uVar13 = 0;
    do {
      local_b0 = (Vertex *)(p_Var14 + 1);
      if (iStack_90._M_current == local_88) {
        std::vector<CGL::Vertex_const*,std::allocator<CGL::Vertex_const*>>::
        _M_realloc_insert<CGL::Vertex_const*const&>
                  ((vector<CGL::Vertex_const*,std::allocator<CGL::Vertex_const*>> *)&local_98,
                   iStack_90,&local_b0);
      }
      else {
        *iStack_90._M_current = local_b0;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      pmVar8 = std::__detail::
               _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_b0);
      *pmVar8 = (mapped_type)uVar13;
      uVar13 = uVar13 + 1;
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)&mesh->vertices);
  }
  uVar15 = uVar13 << 5;
  uVar16 = -(ulong)(uVar13 >> 0x3b != 0) | uVar15;
  pVVar9 = (Vector3D *)operator_new__(uVar16);
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pVVar9->field_0 + uVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pVVar9->field_0 + uVar11 + 0x10) = 0;
      uVar11 = uVar11 + 0x20;
    } while (uVar15 != uVar11);
  }
  this->positions = pVVar9;
  pVVar9 = (Vector3D *)operator_new__(uVar16);
  if (uVar13 != 0) {
    uVar16 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pVVar9->field_0 + uVar16);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pVVar9->field_0 + uVar16 + 0x10) = 0;
      uVar16 = uVar16 + 0x20;
    } while (uVar15 != uVar16);
  }
  this->normals = pVVar9;
  if (uVar13 != 0) {
    lVar12 = 0;
    do {
      lVar2 = *(long *)((long)local_98 + lVar12);
      uVar5 = *(undefined8 *)(lVar2 + 0x18);
      uVar6 = *(undefined8 *)(lVar2 + 0x20);
      uVar7 = *(undefined8 *)(lVar2 + 0x28);
      puVar1 = (undefined8 *)((long)&this->positions->field_0 + lVar12 * 4);
      *puVar1 = *(undefined8 *)(lVar2 + 0x10);
      puVar1[1] = uVar5;
      puVar1[2] = uVar6;
      puVar1[3] = uVar7;
      lVar2 = *(long *)((long)local_98 + lVar12);
      uVar5 = *(undefined8 *)(lVar2 + 0x88);
      uVar6 = *(undefined8 *)(lVar2 + 0x90);
      uVar7 = *(undefined8 *)(lVar2 + 0x98);
      puVar1 = (undefined8 *)((long)&this->normals->field_0 + lVar12 * 4);
      *puVar1 = *(undefined8 *)(lVar2 + 0x80);
      puVar1[1] = uVar5;
      puVar1[2] = uVar6;
      puVar1[3] = uVar7;
      lVar12 = lVar12 + 8;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  p_Var14 = (local_70->faces).super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  plVar10 = &local_70->faces;
  if (p_Var14 != (_List_node_base *)plVar10) {
    do {
      p_Var3 = p_Var14[10]._M_next;
      local_a0 = (key_type)(*(_List_node_base **)((long)(p_Var3 + 2) + 8) + 1);
      pmVar8 = std::__detail::
               _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_a0);
      local_b0 = (Vertex *)(long)*pmVar8;
      iVar4._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (local_a8,iVar4,(unsigned_long *)&local_b0);
      }
      else {
        *iVar4._M_current = (unsigned_long)local_b0;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_a0 = (key_type)(*(long *)((long)p_Var3[2]._M_next + 0x28) + 0x10);
      pmVar8 = std::__detail::
               _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_a0);
      local_b0 = (Vertex *)(long)*pmVar8;
      iVar4._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (local_a8,iVar4,(unsigned_long *)&local_b0);
      }
      else {
        *iVar4._M_current = (unsigned_long)local_b0;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_a0 = (key_type)(*(long *)(*(long *)((long)p_Var3[2]._M_next + 0x20) + 0x28) + 0x10);
      pmVar8 = std::__detail::
               _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_a0);
      local_b0 = (Vertex *)(long)*pmVar8;
      iVar4._M_current =
           (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (local_a8,iVar4,(unsigned_long *)&local_b0);
      }
      else {
        *iVar4._M_current = (unsigned_long)local_b0;
        (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)plVar10);
  }
  this->bsdf = local_78;
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
  }
  std::
  _Hashtable<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {

  unordered_map<const Vertex *, int> vertexLabels;
  vector<const Vertex *> verts;

  size_t vertexI = 0;
  for (VertexCIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    const Vertex *v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals   = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i]   = verts[i]->normal;
  }

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;

}